

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_av1d_vdpu383.c
# Opt level: O3

MPP_RET vdpu383_av1d_gen_regs(void *hal,HalTaskInfo *task)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  byte *pbVar6;
  HalBufs bufs;
  void *pvVar7;
  void *pvVar8;
  byte bVar9;
  RK_U32 RVar10;
  int iVar11;
  RK_U32 RVar12;
  MppFrameFormat MVar13;
  RK_S32 RVar14;
  int iVar15;
  long lVar16;
  size_t sVar17;
  undefined8 *puVar18;
  RK_U64 *pRVar19;
  HalBuf *pHVar20;
  ulong uVar21;
  MppBuffer *ppvVar22;
  uint uVar23;
  long lVar24;
  uint *puVar25;
  uint uVar26;
  char *fmt;
  uint *puVar27;
  DXVA_PicParams_AV1 *pic_param;
  HalTaskInfo *pHVar28;
  uint uVar29;
  RK_U64 RVar30;
  uint uVar31;
  uint uVar32;
  MppBuffer buffer;
  uint uVar33;
  uint uVar34;
  HalBufs *ppvVar35;
  byte *pbVar36;
  int *piVar37;
  long *plVar38;
  long *plVar39;
  bool bVar40;
  MppFrame mframe;
  BitputCtx_t bp;
  RK_U32 mapped_frame_width [8];
  MppBuffer mbuffer;
  MppFrame local_198;
  MppBuffer local_190 [4];
  void *local_170;
  void *local_168;
  undefined8 *local_160;
  RK_U64 *local_158;
  HalTaskInfo *local_150;
  uint *local_148;
  byte *local_140;
  uint *local_138;
  uint *local_130;
  uint *local_128;
  uint *local_120;
  uint *local_118;
  uint *local_110;
  uint *local_108;
  uint *local_100;
  uint *local_f8;
  uint *local_f0;
  uint *local_e8;
  uint *local_e0;
  void *local_d8;
  Vdpu383CtrlReg *local_d0;
  MppBuffer local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 uStack_b0;
  uint *local_a8;
  uint *local_a0;
  uint *local_98;
  uint *local_90;
  uint *local_88;
  uint *local_80;
  uint *local_78;
  uint *local_70;
  uint *local_68;
  MppBuffer local_60;
  uint local_58 [10];
  
  puVar18 = *(undefined8 **)((long)hal + 0x50);
  pbVar6 = (byte *)(task->dec).syntax.data;
  *(uint *)((long)puVar18 + 0x1b684) = (uint)pbVar6[0xc86];
  uVar21 = *(ulong *)((long)task + 8);
  if ((uVar21 & 0xc) != 0) {
    _mpp_log_l(2,"hal_av1d_vdpu383","parse err %d ref err %d\n","vdpu383_av1d_gen_regs",
               (ulong)((uint)(uVar21 >> 2) & 1),(ulong)((uint)uVar21 >> 3 & 1));
    return MPP_OK;
  }
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)hal + 0x20),*pbVar6 & 0x7f,SLOT_FRAME_PTR,&local_198)
  ;
  RVar10 = mpp_frame_get_thumbnail_en(local_198);
  if (RVar10 == 2) {
    uVar23 = *(uint *)(pbVar6 + 4);
    if ((ushort)*(uint *)(pbVar6 + 4) < *(ushort *)(pbVar6 + 2)) {
      uVar23 = (uint)*(ushort *)(pbVar6 + 2);
    }
    if ((0x1000 < (uVar23 & 0xffff)) && (puVar18[0x3d8d] == 0)) {
      lVar16 = *(long *)((long)hal + 0x50);
      local_190[0] = (MppBuffer)mpp_frame_get_buf_size(local_198);
      if (local_190[0] == (MppBuffer)0x0) {
        fmt = "origin_bufs get buf size failed\n";
      }
      else {
        bufs = *(HalBufs *)(lVar16 + 0x1ec68);
        ppvVar35 = (HalBufs *)(lVar16 + 0x1ec68);
        if (bufs != (HalBufs)0x0) {
          hal_bufs_deinit(bufs);
          *ppvVar35 = (HalBufs)0x0;
        }
        hal_bufs_init(ppvVar35);
        if (*ppvVar35 != (HalBufs)0x0) {
          hal_bufs_setup(*ppvVar35,0x10,1,(size_t *)local_190);
          goto LAB_002130f9;
        }
        fmt = "origin_bufs init fail\n";
      }
      _mpp_log_l(2,"hal_av1d_vdpu383",fmt,"vdpu383_setup_scale_origin_bufs");
    }
  }
LAB_002130f9:
  if (*(int *)((long)hal + 0x58) != 0) {
    lVar16 = 0x10;
    lVar24 = 0;
    do {
      if (*(int *)((long)puVar18 + lVar16) == 0) {
        (task->dec).reg_index = (RK_S32)lVar24;
        *puVar18 = *(undefined8 *)((long)puVar18 + lVar16 + 8);
        *(undefined4 *)((long)puVar18 + lVar16) = 1;
        *(undefined4 *)(puVar18 + 1) = *(undefined4 *)((long)puVar18 + lVar24 * 4 + 0x58);
        break;
      }
      lVar24 = lVar24 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar24 != 3);
  }
  pvVar7 = (void *)*puVar18;
  memset(pvVar7,0,0x298);
  local_150 = task;
  sVar17 = mpp_packet_get_length((task->dec).input_packet);
  *(int *)((long)hal + 0x10) = (int)sVar17;
  *(undefined4 *)((long)pvVar7 + 4) = 4;
  *(byte *)((long)pvVar7 + 8) = *(byte *)((long)pvVar7 + 8) & 0xee;
  *(uint *)((long)pvVar7 + 0xc) = *(uint *)((long)pvVar7 + 0xc) | 0x3ff;
  *(undefined4 *)((long)pvVar7 + 0x18) = 0x3fffff;
  *(uint *)((long)pvVar7 + 0x24) = (*(uint *)((long)pvVar7 + 0x24) & 0xfefffefe) + 1;
  *(undefined8 *)((long)pvVar7 + 0x34) = 0x3fffffffffffffdf;
  *(ulong *)((long)pvVar7 + 0x54) =
       *(ulong *)((long)pvVar7 + 0x54) & 0xfe00f000fffff006 | (ulong)DAT_002a2e20;
  *(uint *)((long)pvVar7 + 0x5c) = *(uint *)((long)pvVar7 + 0x5c) & 0xf0fff0ff;
  local_60 = (MppBuffer)0x0;
  local_158 = (RK_U64 *)((long)puVar18 + 0x1e9d4);
  local_170 = hal;
  local_168 = pvVar7;
  mpp_set_bitput_ctx((BitputCtx_t *)local_190,local_158,0x52);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)((uint)*(undefined8 *)(pbVar6 + 0x14) & 0xfff),0xc);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0xc & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x1c & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0xd & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0xe & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0xf & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x11 & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x52f],1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x12 & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,
               (ulong)((uint)((ulong)*(undefined8 *)(pbVar6 + 0x14) >> 0x27) & 1),1);
  uVar21 = (ulong)(pbVar6[0x531] - 1);
  if (pbVar6[0x531] == 0) {
    uVar21 = 0;
  }
  mpp_put_bits((BitputCtx_t *)local_190,uVar21,3);
  pvVar7 = local_168;
  bVar40 = true;
  if (pbVar6[0x55a] == 0) {
    bVar40 = pbVar6[0x55b] != 0;
  }
  RVar30 = 1;
  if (pbVar6[0x56a] == 0) {
    RVar30 = (RK_U64)(pbVar6[0x56b] != 0);
  }
  if (pbVar6[0xc5c] == 0) {
    if (bVar40) {
      RVar30 = 1;
    }
    if (pbVar6[0x559] != 0) {
      RVar30 = 1;
    }
  }
  else {
    RVar30 = 0;
  }
  local_160 = puVar18;
  mpp_put_bits((BitputCtx_t *)local_190,RVar30,1);
  RVar30 = 0;
  uVar21 = (ulong)(*(ushort *)(pbVar6 + 0xe) - 8);
  if (*(ushort *)(pbVar6 + 0xe) < 9) {
    uVar21 = RVar30;
  }
  mpp_put_bits((BitputCtx_t *)local_190,uVar21,3);
  if ((pbVar6[0x52d] == 0) && (RVar30 = 1, pbVar6[0x52c] != 1)) {
    RVar30 = (ulong)(pbVar6[0x52b] == 1) ^ 3;
  }
  local_d0 = (Vdpu383CtrlReg *)((long)pvVar7 + 4);
  mpp_put_bits((BitputCtx_t *)local_190,RVar30,2);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x694],8);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(pbVar6[0x17] & 1),1);
  bVar40 = (pbVar6[0x528] & 0xfd) == 0;
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)bVar40,1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x1e & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x13 & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,
               (ulong)(bVar40 || (*(uint *)(pbVar6 + 0x14) & 0x300000) != 0),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x530],8);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 2),0x10);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 4),0x10);
  mpp_put_bits((BitputCtx_t *)local_190,
               (ulong)((uint)((ulong)*(undefined8 *)(pbVar6 + 0x14) >> 0x22) & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 0xc),5);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(uint *)(pbVar6 + 0xc70),0x10);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x1a & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x19 & 1),1);
  lVar16 = 0x1ce;
  do {
    RVar30 = 0xffffffff;
    if (*(int *)(pbVar6 + 0x734) != 0) {
      RVar30 = (RK_U64)*(uint *)(pbVar6 + lVar16 * 4);
    }
    mpp_put_bits((BitputCtx_t *)local_190,RVar30,3);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x1d5);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0xc64],3);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x1b & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,
               (ulong)((uint)((ulong)*(undefined8 *)(pbVar6 + 0x14) >> 0x26) & 1),1);
  local_140 = pbVar6 + 0x774;
  lVar16 = 0x77c;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(uint *)(pbVar6 + lVar16),8);
    lVar16 = lVar16 + 0x6c;
  } while (lVar16 != 0xadc);
  lVar16 = 0x1ce;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,
                 (ulong)*(uint *)(pbVar6 + (ulong)*(uint *)(pbVar6 + lVar16 * 4) * 4 + 0x754),8);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x1d5);
  lVar24 = 0xc54;
  lVar16 = 0x1e9;
  do {
    if (pbVar6[0x531] == 0) {
      pbVar6[lVar24] = 0;
      bVar9 = 0;
    }
    else if ((char)pbVar6[lVar16 * 4] < '\0') {
      bVar9 = pbVar6[lVar24];
    }
    else {
      uVar26 = 1 << (pbVar6[0x531] - 1 & 0x1f);
      uVar23 = uVar26 - 1 &
               *(int *)(local_140 + (ulong)*(uint *)(pbVar6 + lVar24 * 4 + -0x2a18) * 0x6c + 8) -
               (uint)pbVar6[0x530];
      uVar26 = uVar26 & *(int *)(local_140 +
                                (ulong)*(uint *)(pbVar6 + lVar24 * 4 + -0x2a18) * 0x6c + 8) -
                        (uint)pbVar6[0x530];
      bVar9 = (int)uVar26 < (int)uVar23;
      pbVar6[lVar24] = (int)uVar26 < (int)uVar23;
    }
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)bVar9,1);
    lVar24 = lVar24 + 1;
    lVar16 = lVar16 + 0x1b;
  } while (lVar24 != 0xc5b);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x1d & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x54e],8);
  mpp_put_bits((BitputCtx_t *)local_190,(long)(char)pbVar6[0x54f],7);
  mpp_put_bits((BitputCtx_t *)local_190,(long)(char)pbVar6[0x550],7);
  mpp_put_bits((BitputCtx_t *)local_190,(long)(char)pbVar6[0x552],7);
  mpp_put_bits((BitputCtx_t *)local_190,(long)(char)pbVar6[0x551],7);
  mpp_put_bits((BitputCtx_t *)local_190,(long)(char)pbVar6[0x553],7);
  mpp_put_bits((BitputCtx_t *)local_190,(long)(char)pbVar6[0x554],1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x57c],1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x57d],1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x57f],1);
  if (pbVar6[0x57c] == 0) {
    RVar30 = 0;
  }
  else {
    RVar30 = 0;
    if ((pbVar6[0x52e] != 0) &&
       ((*(ushort *)(pbVar6 + 2) + 7 >> 2 & 0xfffffffe) ==
        (*(int *)(pbVar6 + 0x774) + 7U >> 2 & 0xfffffffe))) {
      RVar30 = (RK_U64)((*(ushort *)(pbVar6 + 4) + 7 >> 2 & 0xfffffffe) ==
                       (*(int *)(pbVar6 + 0x778) + 7U >> 2 & 0xfffffffe));
    }
  }
  mpp_put_bits((BitputCtx_t *)local_190,RVar30,1);
  lVar16 = 0x580;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],8);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x588);
  pbVar36 = pbVar6 + 0x588;
  lVar16 = 0x59c;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16 + -0x14),9);
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16 + -0x10),7);
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16 + -0xc),7);
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16 + -8),7);
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16 + -4),7);
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16),3);
    lVar16 = lVar16 + 0x20;
  } while (lVar16 != 0x69c);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x688],3);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x689],1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x54c],1);
  RVar30 = (long)(1 << (pbVar6[0x54d] & 0x1f));
  if (pbVar6[0x54c] != 0) {
    RVar30 = (ulong)pbVar6[0x54d];
  }
  mpp_put_bits((BitputCtx_t *)local_190,RVar30,2);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x53a],1);
  mpp_put_bits((BitputCtx_t *)local_190,(long)(1 << (pbVar6[0x53b] & 0x1f)),2);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x539],1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0xc5c],1);
  lVar16 = 0x580;
  do {
    uVar23 = (uint)pbVar6[0x54e];
    if ((pbVar6[lVar16] & 1) != 0) {
      uVar23 = (uint)pbVar6[0x54e] + *(int *)pbVar36;
    }
    if (((((int)uVar23 < 1) && (pbVar6[0x54f] == 0)) && (pbVar6[0x550] == 0)) &&
       ((pbVar6[0x551] == 0 && (pbVar6[0x552] == 0)))) {
      RVar30 = (RK_U64)(pbVar6[0x553] == 0);
    }
    else {
      RVar30 = 0;
    }
    mpp_put_bits((BitputCtx_t *)local_190,RVar30,1);
    lVar16 = lVar16 + 1;
    pbVar36 = pbVar36 + 0x20;
  } while (lVar16 != 0x588);
  mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + 0xc60),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x555],4);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x556],4);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x557],4);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x532],6);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x533],6);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x534],6);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x535],6);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x536],3);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x537],1);
  lVar16 = 0x53c;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(long)(char)pbVar6[lVar16],7);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x544);
  mpp_put_bits((BitputCtx_t *)local_190,(long)(char)pbVar6[0x544],7);
  mpp_put_bits((BitputCtx_t *)local_190,(long)(char)pbVar6[0x545],7);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x558] + 3,3);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x559],2);
  lVar16 = 0x2ad;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16 * 2],4);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x2b5);
  lVar16 = 0x2b5;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16 * 2],4);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x2bd);
  lVar16 = 0x55b;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],2);
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x56b);
  lVar16 = 0x56b;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],2);
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x57b);
  uVar23 = 0;
  uVar21 = 0;
  do {
    uVar23 = pbVar6[uVar21 + 0x546] != 0 | uVar23;
    if (pbVar6[0x52d] != 0) break;
    bVar40 = uVar21 < 2;
    uVar21 = uVar21 + 1;
  } while (bVar40);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)uVar23,1);
  lVar16 = 0x546;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],2);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x549);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x549],2);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x54a],2);
  mpp_put_bits((BitputCtx_t *)local_190,
               (ulong)((uint)((ulong)*(undefined8 *)(pbVar6 + 0x14) >> 0x23) & 7),2);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(uint *)(pbVar6 + 0x14) >> 0x1f),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0xc84],3);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0xc85],3);
  mpp_put_bits((BitputCtx_t *)local_190,
               (ulong)((uint)((ulong)*(undefined8 *)(pbVar6 + 0x14) >> 0x20) & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(ushort *)(pbVar6 + 0x16) & 1),1);
  mpp_put_bits((BitputCtx_t *)local_190,
               (ulong)((uint)((ulong)*(undefined8 *)(pbVar6 + 0x14) >> 0x21) & 1),1);
  lVar16 = 0x7a6;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],2);
    lVar16 = lVar16 + 0x6c;
  } while (lVar16 != 0xa9a);
  pbVar36 = pbVar6 + 0x7c0;
  lVar16 = 0;
  do {
    lVar24 = 0;
    do {
      mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar36 + lVar24 * 4),0x11);
      lVar24 = lVar24 + 1;
    } while (lVar24 != 6);
    lVar16 = lVar16 + 1;
    pbVar36 = pbVar36 + 0x6c;
  } while (lVar16 != 7);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x68c],1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 0x72c),0x10);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 0x72e),1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x696],4);
  lVar16 = 0x699;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],8);
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x6b5);
  lVar16 = 0x34d;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16 * 2],8);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x35b);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x68e],1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x697],4);
  lVar16 = 0x6b5;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],8);
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x6c9);
  lVar16 = 0x35b;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16 * 2],8);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x365);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x698],4);
  lVar16 = 0x6c9;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],8);
    lVar16 = lVar16 + 2;
  } while (lVar16 != 0x6dd);
  lVar16 = 0x365;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16 * 2],8);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x36f);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x68d],2);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x68f],2);
  lVar16 = 0x6dd;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],8);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x6f5);
  lVar16 = 0x6f5;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],8);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x70e);
  lVar16 = 0x70e;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[lVar16],8);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x727);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x690],2);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x691],2);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x727],8);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x728],8);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 0x730),9);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x729],8);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x72a],8);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 0x732),9);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x692],1);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x693],1);
  lVar16 = 0xadc;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16),0x10);
    lVar16 = lVar16 + 0x30;
  } while (lVar16 != 0xc5c);
  lVar16 = 0xae4;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16),0x10);
    lVar16 = lVar16 + 0x30;
  } while (lVar16 != 0xc64);
  lVar16 = 0xae0;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16),0x10);
    lVar16 = lVar16 + 0x30;
  } while (lVar16 != 0xc60);
  lVar16 = 0xaf0;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(long)*(int *)(pbVar6 + lVar16),2);
    lVar16 = lVar16 + 0x30;
  } while (lVar16 != 0xc70);
  lVar16 = 0x798;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(uint *)(pbVar6 + lVar16 + -0x18),8);
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(uint *)(pbVar6 + lVar16 + -0x14),8);
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(uint *)(pbVar6 + lVar16 + -0x10),8);
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(uint *)(pbVar6 + lVar16 + -0xc),8);
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(uint *)(pbVar6 + lVar16 + -8),8);
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(uint *)(pbVar6 + lVar16 + -4),8);
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(uint *)(pbVar6 + lVar16),8);
    lVar16 = lVar16 + 0x6c;
  } while (lVar16 != 0xaf8);
  local_b8 = 0;
  uStack_b0 = 0;
  local_c8 = (MppBuffer)0x0;
  uStack_c0 = 0;
  local_58[4] = 0;
  local_58[5] = 0;
  local_58[6] = 0;
  local_58[7] = 0;
  local_58[0] = 0;
  local_58[1] = 0;
  local_58[2] = 0;
  local_58[3] = 0;
  lVar16 = 0x1ce;
  do {
    uVar21 = (ulong)*(uint *)(pbVar6 + lVar16 * 4);
    *(undefined4 *)((long)&local_c8 + uVar21 * 4) = *(undefined4 *)(pbVar6 + uVar21 * 0x30 + 0xae0);
    local_58[uVar21] = *(uint *)(pbVar6 + uVar21 * 0x30 + 0xae4);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x1d5);
  lVar16 = 0;
  do {
    if ((pbVar6[0x17] & 2) == 0) {
      uVar23 = *(uint *)((long)&local_c8 + lVar16 * 4);
      uVar26 = local_58[lVar16];
      uVar2 = *(ushort *)(pbVar6 + 2);
      uVar3 = *(ushort *)(pbVar6 + 4);
    }
    else {
      uVar2 = *(ushort *)(pbVar6 + 2);
      uVar3 = *(ushort *)(pbVar6 + 4);
      uVar23 = (uint)uVar2;
      uVar26 = (uint)uVar3;
    }
    mpp_put_bits((BitputCtx_t *)local_190,
                 (ulong)((uint)(uVar2 >> 1) + uVar23 * 0x4000) / (ulong)uVar2,0x10);
    mpp_put_bits((BitputCtx_t *)local_190,
                 (ulong)((uint)(uVar3 >> 1) + uVar26 * 0x4000) / (ulong)uVar3,0x10);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 8);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)(*(ushort *)(pbVar6 + 0x12) + 7 >> 3),10);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 0x1c),7);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 0x1e),7);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + 0x20),0xc);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0x524] + 1,3);
  mpp_put_bits((BitputCtx_t *)local_190,
               (ulong)*(ushort *)(pbVar6 + 0x1e) * (ulong)*(ushort *)(pbVar6 + 0x1c),0xd);
  mpp_put_bits((BitputCtx_t *)local_190,(ulong)pbVar6[0xc99] + (ulong)pbVar6[0xc98],0xc);
  lVar16 = 0x11;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + lVar16 * 2),7);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x51);
  lVar16 = 0x51;
  do {
    mpp_put_bits((BitputCtx_t *)local_190,(ulong)*(ushort *)(pbVar6 + lVar16 * 2),10);
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x91);
  mpp_put_align((BitputCtx_t *)local_190,0x80,0);
  puVar18 = local_160;
  memcpy((void *)local_160[10],local_158,0x290);
  pHVar28 = local_150;
  pvVar8 = local_168;
  *(undefined4 *)((long)local_168 + 0xf4) = 0x29;
  *(undefined4 *)((long)local_168 + 0x6c) = *(undefined4 *)(puVar18 + 9);
  sVar17 = mpp_packet_get_length((local_150->dec).input_packet);
  pvVar7 = local_170;
  *(int *)((long)local_170 + 0x10) = (int)sVar17;
  *(uint *)((long)pvVar8 + 0xf0) = (int)sVar17 + 0x8eU & 0xffffff80;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)local_170 + 0x28),(pHVar28->dec).input,SLOT_BUFFER,&local_60);
  iVar11 = mpp_buffer_get_fd_with_caller(local_60,"vdpu383_av1d_gen_regs");
  *(int *)((long)pvVar8 + 0x60) = iVar11;
  uVar23 = *(uint *)(puVar18 + 1);
  *(uint *)((long)pvVar8 + 0xec) = uVar23 * 8 & 0x78;
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar7 + 0x48),0x80,uVar23 & 0xfffffff0);
  iVar11 = mpp_buffer_get_fd_with_caller(local_60,"vdpu383_av1d_gen_regs");
  *(int *)((long)pvVar8 + 0x198) = iVar11;
  lVar16 = *(long *)((long)pvVar7 + 0x50);
  local_158 = (RK_U64 *)CONCAT44(local_158._4_4_,*(undefined4 *)((long)pvVar7 + 0x58));
  uVar2 = *(ushort *)(pbVar6 + 2);
  uVar26 = ((uVar2 + 7 >> 3) * 100 + 7 >> 3) + 0x3f & 0x1fffffc0;
  *(undefined4 *)(lVar16 + 100) = 0x8c;
  *(undefined8 *)(lVar16 + 0x6c) = 0x8e00000000;
  *(uint *)(lVar16 + 0x68) = uVar26;
  *(uint *)(lVar16 + 0x78) = uVar26;
  *(uint *)(lVar16 + 0x74) = uVar26;
  uVar23 = (uVar2 + 0x3f >> 6) * 0x158 + 0x3f & 0xffffffc0;
  *(undefined4 *)(lVar16 + 0x7c) = 0x90;
  *(uint *)(lVar16 + 0x84) = uVar26 * 2;
  *(uint *)(lVar16 + 0x80) = uVar23;
  iVar11 = uVar23 + uVar26 * 2;
  *(undefined4 *)(lVar16 + 0x88) = 0x92;
  *(int *)(lVar16 + 0x90) = iVar11;
  *(uint *)(lVar16 + 0x8c) = uVar23;
  iVar11 = uVar23 + iVar11;
  uVar23 = (uVar2 + 0x1ff & 0x1fe00) * 0x24 >> 3;
  *(undefined4 *)(lVar16 + 0x94) = 0x94;
  *(int *)(lVar16 + 0x9c) = iVar11;
  *(uint *)(lVar16 + 0x98) = uVar23;
  iVar11 = iVar11 + uVar23;
  *(undefined4 *)(lVar16 + 0xa0) = 0x96;
  *(int *)(lVar16 + 0xa8) = iVar11;
  *(uint *)(lVar16 + 0xa4) = uVar23;
  iVar11 = iVar11 + uVar23;
  uVar23 = uVar2 + 0x3f & 0xffffffc0;
  iVar15 = uVar23 * 0x44;
  *(undefined4 *)(lVar16 + 0xac) = 0x98;
  *(int *)(lVar16 + 0xb4) = iVar11;
  *(int *)(lVar16 + 0xb0) = iVar15;
  iVar11 = iVar11 + iVar15;
  *(undefined4 *)(lVar16 + 0xb8) = 0x9a;
  *(int *)(lVar16 + 0xc0) = iVar11;
  *(int *)(lVar16 + 0xbc) = iVar15;
  iVar11 = iVar11 + iVar15;
  *(undefined4 *)(lVar16 + 0xc4) = 0x9c;
  *(int *)(lVar16 + 0xcc) = iVar11;
  *(int *)(lVar16 + 200) = iVar15;
  iVar11 = iVar11 + iVar15;
  uVar26 = (uVar23 * 0x7d6 >> 3) + 0x3f & 0xffffffc0;
  *(undefined4 *)(lVar16 + 0xd0) = 0x9e;
  *(int *)(lVar16 + 0xd8) = iVar11;
  *(uint *)(lVar16 + 0xd4) = uVar26;
  iVar11 = uVar26 + iVar11;
  uVar23 = (uVar23 * 0xdc >> 3) + 0x3f & 0xffffffc0;
  *(undefined4 *)(lVar16 + 0xdc) = 0xa0;
  *(int *)(lVar16 + 0xe4) = iVar11;
  *(uint *)(lVar16 + 0xe0) = uVar23;
  *(uint *)(lVar16 + 0xe8) = uVar23 + iVar11;
  uVar3 = *(ushort *)(pbVar6 + 4);
  local_148 = (uint *)(ulong)uVar3;
  uVar4 = *(ushort *)(pbVar6 + 0x1e);
  uVar5 = *(ushort *)(pbVar6 + 0x1c);
  uVar26 = (uint)((*(ulong *)(pbVar6 + 0x14) & 0x1000) == 0) << 6 | 0xffffff80;
  iVar11 = (uint)uVar4 * 0x200;
  uVar31 = ((uint)*(ulong *)(pbVar6 + 0x14) & 0x1000) >> 6;
  uVar32 = uVar31 + uVar2 + 0x3f & uVar26;
  uVar2 = *(ushort *)(pbVar6 + 0xe);
  *(uint *)(lVar16 + 0x68) = ((uVar32 >> 3) * 100 >> 3) + 0x3f & 0x1fffffc0;
  *(undefined4 *)(lVar16 + 0x74) = 0;
  *(uint *)(lVar16 + 0x80) = (uVar32 >> 6) * 0x158 + 0x3f & 0x1fffc0;
  uVar23 = 0;
  if (1 < uVar4) {
    uVar23 = ((uVar32 >> 6) * 0xac0 + iVar11 >> 3) + 0x3f & 0x1fffffc0;
  }
  uVar34 = ((uint)uVar2 + (uint)uVar2 * 2 + 6) * (uVar32 + 0x1ff & 0x3fe00);
  uVar33 = ((uint)uVar2 << 5 | 10) * uVar32;
  uVar29 = (uVar33 >> 4) + 0x3f & 0xffffffc0;
  iVar15 = uVar29 + 0x6c00;
  if (uVar32 < 0x1001) {
    iVar15 = uVar29 + 0x2000;
  }
  uVar29 = (uVar33 + iVar11 >> 3) + 0x3f & 0xffffffc0;
  *(uint *)(lVar16 + 0x8c) = uVar23;
  uVar32 = 0;
  uVar23 = uVar34 + iVar11 >> 3;
  if (uVar4 < 2) {
    uVar23 = 0;
  }
  *(uint *)(lVar16 + 0x98) = uVar34 >> 3;
  *(uint *)(lVar16 + 0xa4) = uVar23;
  *(int *)(lVar16 + 0xb0) = iVar15;
  *(int *)(lVar16 + 0xbc) = iVar15;
  if (uVar4 < 2) {
    uVar29 = 0;
  }
  *(uint *)(lVar16 + 200) = uVar29;
  if (1 < uVar5) {
    uVar32 = (((uint)uVar2 * 0x65 + 0x20) * (uVar3 + uVar31 + 0x3f & uVar26) + (uint)uVar5 * 0x200
             >> 3) + 0x3f & 0xffffffc0;
  }
  local_d8 = (void *)((long)local_168 + 0xe8);
  *(uint *)(lVar16 + 0xd4) = uVar32;
  uVar21 = 0;
  do {
    local_190[0] = *(MppBuffer *)(lVar16 + 0xf0 + uVar21 * 8);
    if (local_190[0] != (MppBuffer)0x0) {
      mpp_buffer_put_with_caller(local_190[0],"vdpu383_av1d_rcb_setup");
      *(undefined8 *)(lVar16 + 0xf0 + uVar21 * 8) = 0;
    }
    mpp_buffer_get_with_tag
              (*(MppBufferGroup *)((long)local_170 + 0x38),local_190,(ulong)*(uint *)(lVar16 + 0xe8)
               ,"hal_av1d_vdpu383","vdpu383_av1d_rcb_setup");
    pvVar7 = local_170;
    *(MppBuffer *)(lVar16 + 0xf0 + uVar21 * 8) = local_190[0];
  } while (((int)local_158 != 0) && (bVar40 = uVar21 < 2, uVar21 = uVar21 + 1, bVar40));
  puVar18 = local_160 + 0x1e;
  if (*(int *)((long)local_170 + 0x58) != 0) {
    puVar18 = puVar18 + (local_150->dec).reg_index;
  }
  plVar38 = *(long **)((long)local_170 + 0x50);
  lVar16 = *plVar38;
  iVar11 = mpp_buffer_get_fd_with_caller((MppBuffer)*puVar18,"vdpu383_av1d_rcb_reg_cfg");
  *(int *)(lVar16 + 0x90) = iVar11;
  *(int *)(lVar16 + 0x98) = iVar11;
  *(int *)(lVar16 + 0xa0) = iVar11;
  *(int *)(lVar16 + 0xa8) = iVar11;
  *(int *)(lVar16 + 0xb0) = iVar11;
  *(int *)(lVar16 + 0xb8) = iVar11;
  *(int *)(lVar16 + 0xc0) = iVar11;
  *(int *)(lVar16 + 200) = iVar11;
  *(int *)(lVar16 + 0xd0) = iVar11;
  *(int *)(lVar16 + 0xd8) = iVar11;
  *(int *)(lVar16 + 0xe0) = iVar11;
  *(int *)(lVar16 + 0x94) = (int)plVar38[0xd];
  *(undefined4 *)(lVar16 + 0x9c) = *(undefined4 *)((long)plVar38 + 0x74);
  *(int *)(lVar16 + 0xa4) = (int)plVar38[0x10];
  *(undefined4 *)(lVar16 + 0xac) = *(undefined4 *)((long)plVar38 + 0x8c);
  *(int *)(lVar16 + 0xb4) = (int)plVar38[0x13];
  *(undefined4 *)(lVar16 + 0xbc) = *(undefined4 *)((long)plVar38 + 0xa4);
  *(int *)(lVar16 + 0xc4) = (int)plVar38[0x16];
  *(undefined4 *)(lVar16 + 0xcc) = *(undefined4 *)((long)plVar38 + 0xbc);
  *(int *)(lVar16 + 0xd4) = (int)plVar38[0x19];
  *(undefined4 *)(lVar16 + 0xdc) = *(undefined4 *)((long)plVar38 + 0xd4);
  *(int *)(lVar16 + 0xe4) = (int)plVar38[0x1c];
  lVar16 = 0x6c;
  do {
    mpp_dev_set_reg_offset
              (*(MppDev *)((long)pvVar7 + 0x48),*(RK_S32 *)((long)plVar38 + lVar16 + -8),
               *(RK_U32 *)((long)plVar38 + lVar16));
    lVar16 = lVar16 + 0xc;
  } while (lVar16 != 0xf0);
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar7 + 0x20),*pbVar6 & 0x7f,SLOT_FRAME_PTR,&local_198);
  pvVar7 = local_168;
  if (local_198 != (MppFrame)0x0) {
    RVar10 = mpp_frame_get_hor_stride(local_198);
    RVar12 = mpp_frame_get_ver_stride(local_198);
    MVar13 = mpp_frame_get_fmt(local_198);
    if ((MVar13 & 0xf00000) == MPP_FMT_YUV420SP) {
      uVar23 = RVar12 * RVar10;
      MVar13 = mpp_frame_get_fmt(local_198);
      if ((MVar13 >> 0x19 & 1) == 0) {
        *(uint *)((long)pvVar7 + 8) = *(uint *)((long)pvVar7 + 8) & 0xfffffffe;
        uVar26 = RVar10 >> 4;
        *(uint *)((long)pvVar7 + 0xf8) = uVar26;
        *(uint *)((long)pvVar7 + 0xfc) = uVar26;
        uVar23 = uVar23 >> 4;
        *(uint *)((long)pvVar7 + 0x100) = uVar23;
      }
      else {
        *(uint *)((long)pvVar7 + 8) = *(uint *)((long)pvVar7 + 8) | 2;
        uVar26 = RVar10 * 6 + 0xf >> 4;
        *(uint *)((long)pvVar7 + 0xf8) = uVar26;
        uVar23 = (uVar23 >> 1) + uVar23 >> 4;
        *(uint *)((long)pvVar7 + 0x100) = uVar23;
      }
    }
    else {
      RVar10 = mpp_frame_get_fbc_hdr_stride(local_198);
      RVar12 = mpp_frame_get_height(local_198);
      *(byte *)((long)pvVar7 + 8) = *(byte *)((long)pvVar7 + 8) | 1;
      uVar26 = RVar10 >> 6;
      *(uint *)((long)pvVar7 + 0xf8) = uVar26;
      *(RK_U32 *)((long)pvVar7 + 0x1f8) = (RVar12 + 0x3f & 0x3fffffc0) * uVar26 * 4;
      uVar23 = *(uint *)((long)pvVar7 + 0x100);
    }
    *(uint *)((long)pvVar7 + 0x128) = uVar26;
    *(undefined4 *)((long)pvVar7 + 300) = *(undefined4 *)((long)pvVar7 + 0xfc);
    *(uint *)((long)pvVar7 + 0x130) = uVar23;
  }
  local_e0 = (uint *)((long)pvVar7 + 0x188);
  local_e8 = (uint *)((long)pvVar7 + 0x18c);
  local_f0 = (uint *)((long)pvVar7 + 400);
  local_f8 = (uint *)((long)pvVar7 + 0x17c);
  local_100 = (uint *)((long)pvVar7 + 0x180);
  local_108 = (uint *)((long)pvVar7 + 0x184);
  local_110 = (uint *)((long)pvVar7 + 0x170);
  local_118 = (uint *)((long)pvVar7 + 0x174);
  local_120 = (uint *)((long)pvVar7 + 0x178);
  local_128 = (uint *)((long)pvVar7 + 0x164);
  local_130 = (uint *)((long)pvVar7 + 0x168);
  local_138 = (uint *)((long)pvVar7 + 0x16c);
  local_68 = (uint *)((long)pvVar7 + 0x158);
  local_70 = (uint *)((long)pvVar7 + 0x15c);
  local_78 = (uint *)((long)pvVar7 + 0x160);
  local_80 = (uint *)((long)pvVar7 + 0x14c);
  local_88 = (uint *)((long)pvVar7 + 0x150);
  local_90 = (uint *)((long)pvVar7 + 0x154);
  local_98 = (uint *)((long)pvVar7 + 0x140);
  local_a0 = (uint *)((long)pvVar7 + 0x144);
  local_a8 = (uint *)((long)pvVar7 + 0x148);
  local_158 = (RK_U64 *)((long)pvVar7 + 0x134);
  local_148 = (uint *)((long)pvVar7 + 0x138);
  lVar16 = 0x1ce;
  do {
    uVar23 = *(uint *)(pbVar6 + lVar16 * 4);
    if (((local_140[(ulong)uVar23 * 0x6c + 0x30] | 0x80) != 0xff) &&
       (mpp_buf_slot_get_prop
                  (*(MppBufSlots *)((long)local_170 + 0x20),
                   (int)(char)local_140[(ulong)uVar23 * 0x6c + 0x30],SLOT_FRAME_PTR,&local_198),
       local_198 != (MppFrame)0x0)) {
      RVar10 = mpp_frame_get_hor_stride(local_198);
      RVar12 = mpp_frame_get_ver_stride(local_198);
      uVar26 = RVar12 * RVar10;
      MVar13 = mpp_frame_get_fmt(local_198);
      if ((MVar13 & 0xf00000) == MPP_FMT_YUV420SP) {
        MVar13 = mpp_frame_get_fmt(local_198);
        if ((MVar13 >> 0x19 & 1) != 0) {
          RVar10 = RVar10 * 6 + 0xf;
          uVar26 = uVar26 + (uVar26 >> 1);
        }
      }
      else {
        RVar10 = mpp_frame_get_fbc_hdr_stride(local_198);
        RVar10 = RVar10 >> 2;
      }
      pRVar19 = local_158;
      puVar25 = local_148;
      puVar27 = (uint *)((long)pvVar7 + 0x13c);
      switch(uVar23) {
      case 0:
        break;
      case 1:
        pRVar19 = (RK_U64 *)local_98;
        puVar25 = local_a0;
        puVar27 = local_a8;
        break;
      case 2:
        pRVar19 = (RK_U64 *)local_80;
        puVar25 = local_88;
        puVar27 = local_90;
        break;
      case 3:
        pRVar19 = (RK_U64 *)local_68;
        puVar25 = local_70;
        puVar27 = local_78;
        break;
      case 4:
        pRVar19 = (RK_U64 *)local_128;
        puVar25 = local_130;
        puVar27 = local_138;
        break;
      case 5:
        pRVar19 = (RK_U64 *)local_110;
        puVar25 = local_118;
        puVar27 = local_120;
        break;
      case 6:
        pRVar19 = (RK_U64 *)local_f8;
        puVar25 = local_100;
        puVar27 = local_108;
        break;
      case 7:
        pRVar19 = (RK_U64 *)local_e0;
        puVar25 = local_e8;
        puVar27 = local_f0;
        break;
      default:
        goto switchD_00214c08_default;
      }
      *(RK_U32 *)pRVar19 = RVar10 >> 4;
      *puVar25 = RVar10 >> 4;
      *puVar27 = uVar26 >> 4;
    }
switchD_00214c08_default:
    pHVar28 = local_150;
    pvVar8 = local_170;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x1d5);
  local_c8 = (MppBuffer)0x0;
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)local_170 + 0x20),(local_150->dec).output,SLOT_FRAME_PTR,
             &local_198);
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar8 + 0x20),(pHVar28->dec).output,SLOT_BUFFER,&local_c8);
  iVar11 = mpp_buffer_get_fd_with_caller(local_c8,"vdpu383_av1d_gen_regs");
  pvVar7 = local_168;
  *(int *)((long)local_168 + 0x194) = iVar11;
  iVar11 = mpp_buffer_get_fd_with_caller(local_c8,"vdpu383_av1d_gen_regs");
  *(int *)((long)pvVar7 + 500) = iVar11;
  local_148 = (uint *)((long)pvVar7 + 0x1b8);
  local_150 = (HalTaskInfo *)((long)pvVar7 + 0x21c);
  local_e0 = (uint *)((long)pvVar7 + 0x1b4);
  local_e8 = (uint *)((long)pvVar7 + 0x218);
  local_f0 = (uint *)((long)pvVar7 + 0x1b0);
  local_f8 = (uint *)((long)pvVar7 + 0x214);
  local_100 = (uint *)((long)pvVar7 + 0x1ac);
  local_108 = (uint *)((long)pvVar7 + 0x210);
  local_110 = (uint *)((long)pvVar7 + 0x1a8);
  local_118 = (uint *)((long)pvVar7 + 0x20c);
  local_120 = (uint *)((long)pvVar7 + 0x1a4);
  local_128 = (uint *)((long)pvVar7 + 0x208);
  local_130 = (uint *)((long)pvVar7 + 0x1a0);
  local_138 = (uint *)((long)pvVar7 + 0x204);
  local_158 = (RK_U64 *)((long)pvVar7 + 0x19c);
  lVar16 = 0x1ce;
  do {
    uVar23 = *(uint *)(pbVar6 + lVar16 * 4);
    lVar24 = (ulong)uVar23 * 0x6c;
    if ((local_140[lVar24 + 0x30] | 0x80) != 0xff) {
      mpp_buf_slot_get_prop
                (*(MppBufSlots *)((long)local_170 + 0x20),(int)(char)local_140[lVar24 + 0x30],
                 SLOT_BUFFER,&local_c8);
      if ((local_160[0x3d8d] != 0) && (RVar10 = mpp_frame_get_thumbnail_en(local_198), RVar10 == 2))
      {
        pHVar20 = hal_bufs_get_buf((HalBufs)local_160[0x3d8d],(int)(char)local_140[lVar24 + 0x30]);
        local_c8 = *pHVar20->buf;
      }
      if (local_c8 != (MppBuffer)0x0) {
        pHVar28 = (HalTaskInfo *)((long)pvVar7 + 0x200);
        pRVar19 = local_158;
        switch(uVar23) {
        case 0:
          break;
        case 1:
          pHVar28 = (HalTaskInfo *)local_138;
          pRVar19 = (RK_U64 *)local_130;
          break;
        case 2:
          pHVar28 = (HalTaskInfo *)local_128;
          pRVar19 = (RK_U64 *)local_120;
          break;
        case 3:
          pHVar28 = (HalTaskInfo *)local_118;
          pRVar19 = (RK_U64 *)local_110;
          break;
        case 4:
          pHVar28 = (HalTaskInfo *)local_108;
          pRVar19 = (RK_U64 *)local_100;
          break;
        case 5:
          pHVar28 = (HalTaskInfo *)local_f8;
          pRVar19 = (RK_U64 *)local_f0;
          break;
        case 6:
          pHVar28 = (HalTaskInfo *)local_e8;
          pRVar19 = (RK_U64 *)local_e0;
          break;
        case 7:
          pHVar28 = local_150;
          pRVar19 = (RK_U64 *)local_148;
          break;
        default:
          goto switchD_00214eeb_default;
        }
        iVar11 = mpp_buffer_get_fd_with_caller(local_c8,"vdpu383_av1d_gen_regs");
        *(int *)pRVar19 = iVar11;
        iVar11 = mpp_buffer_get_fd_with_caller(local_c8,"vdpu383_av1d_gen_regs");
        *(int *)&pHVar28->dec = iVar11;
      }
    }
switchD_00214eeb_default:
    puVar18 = local_160;
    pvVar8 = local_170;
    lVar16 = lVar16 + 1;
  } while (lVar16 != 0x1d5);
  lVar16 = *(long *)((long)local_170 + 0x50);
  uVar23 = (*(ushort *)(pbVar6 + 2) + 0x3f >> 2 & 0xfffffff0) *
           (*(ushort *)(pbVar6 + 4) + 0x3f & 0xffffffc0);
  local_190[0] = (MppBuffer)(ulong)uVar23;
  ppvVar35 = (HalBufs *)(lVar16 + 0x108);
  if (*(HalBufs *)(lVar16 + 0x108) != (HalBufs)0x0) {
    if (uVar23 <= *(uint *)(lVar16 + 0x114)) goto LAB_00215047;
    hal_bufs_deinit(*(HalBufs *)(lVar16 + 0x108));
    *ppvVar35 = (HalBufs)0x0;
  }
  hal_bufs_init(ppvVar35);
  if (*ppvVar35 == (HalBufs)0x0) {
    _mpp_log_l(2,"hal_av1d_vdpu383","colmv bufs init fail","vdpu383_av1d_colmv_setup");
  }
  else {
    *(uint *)(lVar16 + 0x114) = uVar23;
    RVar14 = mpp_buf_slot_get_count(*(MppBufSlots *)((long)pvVar8 + 0x20));
    *(RK_S32 *)(lVar16 + 0x110) = RVar14;
    hal_bufs_setup(*(HalBufs *)(lVar16 + 0x108),RVar14,1,(size_t *)local_190);
  }
LAB_00215047:
  pHVar20 = hal_bufs_get_buf((HalBufs)puVar18[0x21],*pbVar6 & 0x7f);
  iVar11 = mpp_buffer_get_fd_with_caller(*pHVar20->buf,"vdpu383_av1d_gen_regs");
  *(int *)((long)local_168 + 0x254) = iVar11;
  piVar37 = (int *)((long)local_168 + 600);
  lVar16 = 0x1e9;
  do {
    if ((pbVar6[lVar16 * 4] | 0x80) != 0xff) {
      pHVar20 = hal_bufs_get_buf((HalBufs)puVar18[0x21],(int)(char)pbVar6[lVar16 * 4]);
      iVar11 = mpp_buffer_get_fd_with_caller(*pHVar20->buf,"vdpu383_av1d_gen_regs");
      *piVar37 = iVar11;
    }
    piVar37 = piVar37 + 1;
    lVar16 = lVar16 + 0x1b;
  } while (lVar16 != 0x2c1);
  plVar38 = *(long **)((long)pvVar8 + 0x50);
  if (plVar38[0x4c] == 0) {
    uVar23 = ((uint)*(ushort *)(pbVar6 + 2) * 4 + 0x1fc & 0x7fe00) *
             (*(ushort *)(pbVar6 + 4) + 0x7f >> 7) + 0x73a0;
    local_190[0] = (MppBuffer)(ulong)uVar23;
    hal_bufs_init((HalBufs *)(plVar38 + 0x4c));
    if ((HalBufs)plVar38[0x4c] == (HalBufs)0x0) {
      _mpp_log_l(2,"hal_av1d_vdpu383","cdf bufs init fail","vdpu383_av1d_cdf_setup");
    }
    else {
      *(uint *)((long)plVar38 + 0x26c) = uVar23;
      RVar14 = mpp_buf_slot_get_count(*(MppBufSlots *)((long)pvVar8 + 0x20));
      *(RK_S32 *)(plVar38 + 0x4d) = RVar14;
      hal_bufs_setup((HalBufs)plVar38[0x4c],RVar14,1,(size_t *)local_190);
    }
    plVar38 = *(long **)((long)pvVar8 + 0x50);
  }
  bVar9 = pbVar6[0x528];
  if (bVar9 == 0) {
    lVar16 = 0;
    do {
      *(undefined4 *)((long)plVar38 + lVar16 + 0x124) = 0;
      lVar16 = lVar16 + 0x28;
    } while (lVar16 != 0x140);
  }
  bVar1 = pbVar6[0x54e];
  iVar11 = 0;
  if ((0x14 < bVar1) && (iVar11 = 1, 0x3c < bVar1)) {
    iVar11 = 3 - (uint)(bVar1 < 0x79);
  }
  lVar16 = *plVar38;
  if ((bVar9 == 0) || ((ulong)pbVar6[0x52e] == 7)) {
    iVar15 = mpp_buffer_get_fd_with_caller((MppBuffer)plVar38[0x4b],"vdpu383_av1d_set_cdf");
    *(int *)(lVar16 + 0x1d4) = iVar15;
    buffer = (MppBuffer)plVar38[0x4b];
    lVar24 = 0x1bc;
  }
  else {
    uVar21 = (ulong)*(uint *)(pbVar6 + (ulong)pbVar6[0x52e] * 4 + 0x738);
    iVar11 = (int)plVar38[uVar21 * 5 + 0x25];
    if (((pbVar6[0x17] & 0x20) == 0) && (*(int *)((long)plVar38 + uVar21 * 0x28 + 0x124) != 0)) {
      pHVar20 = hal_bufs_get_buf((HalBufs)plVar38[0x4c],(int)(char)local_140[uVar21 * 0x6c + 0x30]);
      ppvVar22 = pHVar20->buf;
    }
    else {
      ppvVar22 = (MppBuffer *)(plVar38 + 0x4b);
    }
    buffer = *ppvVar22;
    iVar15 = mpp_buffer_get_fd_with_caller(buffer,"vdpu383_av1d_set_cdf");
    *(int *)(lVar16 + 0x1d4) = iVar15;
    iVar15 = mpp_buffer_get_fd_with_caller(buffer,"vdpu383_av1d_set_cdf");
    *(int *)(lVar16 + 0x1bc) = iVar15;
    lVar24 = 0x1c8;
  }
  iVar15 = mpp_buffer_get_fd_with_caller(buffer,"vdpu383_av1d_set_cdf");
  *(int *)(lVar16 + lVar24) = iVar15;
  pHVar20 = hal_bufs_get_buf((HalBufs)plVar38[0x4c],*pbVar6 & 0x7f);
  iVar15 = mpp_buffer_get_fd_with_caller(*pHVar20->buf,"vdpu383_av1d_set_cdf");
  *(int *)(lVar16 + 0x1d8) = iVar15;
  iVar15 = mpp_buffer_get_fd_with_caller(*pHVar20->buf,"vdpu383_av1d_set_cdf");
  *(int *)(lVar16 + 0x1c0) = iVar15;
  iVar15 = mpp_buffer_get_fd_with_caller(*pHVar20->buf,"vdpu383_av1d_set_cdf");
  pvVar7 = local_170;
  *(int *)(lVar16 + 0x1cc) = iVar15;
  mpp_dev_set_reg_offset(*(MppDev *)((long)local_170 + 0x48),0xb2,iVar11 * 0x1620 + 0x1b20);
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar7 + 0x48),0xb3,0x1b20);
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar7 + 0x48),0xb5,0x73a0);
  mpp_dev_set_reg_offset(*(MppDev *)((long)pvVar7 + 0x48),0xb6,0x73a0);
  bVar9 = pbVar6[0xc86];
  plVar39 = plVar38 + 0x25;
  lVar16 = 0;
  do {
    if ((bVar9 >> ((uint)lVar16 & 0x1f) & 1) != 0) {
      if ((pbVar6[0x17] & 0x20) == 0) {
        *(undefined8 *)((long)plVar39 + -4) = 1;
      }
      else if ((*(int *)(pbVar6 + 0xc78) == 0) || (pbVar6[0x528] != 0)) {
        *(int *)plVar39 = iVar11;
      }
      else {
        *(int *)plVar39 = (int)plVar38[(ulong)*(uint *)(pbVar6 + 0xc74) * 5 + 0x25];
      }
    }
    lVar16 = lVar16 + 1;
    plVar39 = plVar39 + 5;
  } while (lVar16 != 8);
  mpp_buffer_sync_end_f((MppBuffer)local_160[8],0,"vdpu383_av1d_gen_regs");
  local_190[0] = (MppBuffer)0x0;
  mpp_buf_slot_get_prop(*(MppBufSlots *)((long)pvVar7 + 0x20),*pbVar6 & 0x7f,SLOT_BUFFER,local_190);
  mpp_buf_slot_get_prop
            (*(MppBufSlots *)((long)pvVar7 + 0x20),*pbVar6 & 0x7f,SLOT_FRAME_PTR,&local_198);
  RVar10 = mpp_frame_get_thumbnail_en(local_198);
  iVar11 = mpp_buffer_get_fd_with_caller(local_190[0],"vdpu383_av1d_gen_regs");
  pvVar7 = local_168;
  if (RVar10 == 1) {
    *(int *)((long)local_168 + 0x74) = iVar11;
  }
  else {
    if (RVar10 != 2) {
      *(byte *)((long)local_168 + 8) = *(byte *)((long)local_168 + 8) & 0xdf;
      return MPP_OK;
    }
    *(int *)((long)local_168 + 0x74) = iVar11;
    pHVar20 = hal_bufs_get_buf((HalBufs)local_160[0x3d8d],*pbVar6 & 0x7f);
    iVar11 = mpp_buffer_get_fd_with_caller(*pHVar20->buf,"vdpu383_av1d_gen_regs");
    *(int *)((long)pvVar7 + 0x194) = iVar11;
    *(int *)((long)pvVar7 + 500) = iVar11;
    *(int *)((long)pvVar7 + 0x198) = iVar11;
  }
  vdpu383_setup_down_scale(local_198,*(MppDev *)((long)local_170 + 0x48),local_d0,local_d8);
  return MPP_OK;
}

Assistant:

MPP_RET vdpu383_av1d_gen_regs(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_ERR_UNKNOW;
    Av1dHalCtx *p_hal = (Av1dHalCtx *)hal;
    Vdpu383Av1dRegCtx *ctx = (Vdpu383Av1dRegCtx *)p_hal->reg_ctx;
    Vdpu383Av1dRegSet *regs;
    DXVA_PicParams_AV1 *dxva = (DXVA_PicParams_AV1*)task->dec.syntax.data;
    RK_U32 i = 0;
    HalBuf *origin_buf = NULL;
    MppFrame mframe;

    INP_CHECK(ret, NULL == p_hal);

    ctx->refresh_frame_flags = dxva->refresh_frame_flags;

    if (task->dec.flags.parse_err ||
        task->dec.flags.ref_err) {
        mpp_err_f("parse err %d ref err %d\n",
                  task->dec.flags.parse_err, task->dec.flags.ref_err);
        goto __RETURN;
    }

    mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_FRAME_PTR, &mframe);
    if (mpp_frame_get_thumbnail_en(mframe) == MPP_FRAME_THUMBNAIL_ONLY &&
        MPP_MAX(dxva->width, dxva->height) > 4096 && ctx->origin_bufs == NULL) {
        vdpu383_setup_scale_origin_bufs(p_hal, mframe);
    }

    if (p_hal->fast_mode) {
        for (i = 0; i <  MPP_ARRAY_ELEMS(ctx->reg_buf); i++) {
            if (!ctx->reg_buf[i].valid) {
                task->dec.reg_index = i;
                ctx->regs = ctx->reg_buf[i].regs;
                ctx->reg_buf[i].valid = 1;
                ctx->offset_uncomps = ctx->uncmps_offset[i];
                break;
            }
        }
    }
    regs = ctx->regs;
    memset(regs, 0, sizeof(*regs));
    p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);

#ifdef DUMP_AV1D_VDPU383_DATAS
    {
        memset(dump_cur_dir, 0, sizeof(dump_cur_dir));
        sprintf(dump_cur_dir, "av1/Frame%04d", dump_cur_frame);
        if (access(dump_cur_dir, 0)) {
            if (mkdir(dump_cur_dir))
                mpp_err_f("error: mkdir %s\n", dump_cur_dir);
        }
        dump_cur_frame++;
    }
#endif

    /* set reg -> ctrl reg */
    {
        regs->ctrl_regs.reg8_dec_mode          = 4; // av1
        regs->ctrl_regs.reg9.fbc_e             = 0;
        regs->ctrl_regs.reg9.buf_empty_en      = 0;

        regs->ctrl_regs.reg10.strmd_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.inter_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.intra_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.transd_auto_gating_e   = 1;
        regs->ctrl_regs.reg10.recon_auto_gating_e    = 1;
        regs->ctrl_regs.reg10.filterd_auto_gating_e  = 1;
        regs->ctrl_regs.reg10.bus_auto_gating_e      = 1;
        regs->ctrl_regs.reg10.ctrl_auto_gating_e     = 1;
        regs->ctrl_regs.reg10.rcb_auto_gating_e      = 1;
        regs->ctrl_regs.reg10.err_prc_auto_gating_e  = 1;

        // regs->ctrl_regs.reg11.dec_timeout_dis        = 1;

        regs->ctrl_regs.reg13_core_timeout_threshold  = 0x3fffff;

        regs->ctrl_regs.reg16.error_proc_disable     = 1;
        regs->ctrl_regs.reg16.error_spread_disable   = 0;
        regs->ctrl_regs.reg16.roi_error_ctu_cal_en   = 0;

        regs->ctrl_regs.reg20_cabac_error_en_lowbits  = 0xffffffdf;
        regs->ctrl_regs.reg21_cabac_error_en_highbits = 0x3fffffff;

        regs->ctrl_regs.reg28.axi_perf_work_e = 1;
        regs->ctrl_regs.reg28.axi_cnt_type    = 1;
        regs->ctrl_regs.reg28.rd_latency_id   = 11;

        regs->ctrl_regs.reg29.addr_align_type     = 1;
        regs->ctrl_regs.reg29.ar_cnt_id_type      = 0;
        regs->ctrl_regs.reg29.aw_cnt_id_type      = 1;
        regs->ctrl_regs.reg29.ar_count_id         = 17;
        regs->ctrl_regs.reg29.aw_count_id         = 0;
        regs->ctrl_regs.reg29.rd_band_width_mode  = 0;

        regs->ctrl_regs.reg30.axi_wr_qos = 0;
        regs->ctrl_regs.reg30.axi_rd_qos = 0;
    }

    /* set reg -> pkt data */
    {
        MppBuffer mbuffer = NULL;

        /* uncompress header data */
        prepare_uncompress_header(p_hal, dxva, (RK_U64 *)ctx->header_data, sizeof(ctx->header_data) / 8);
        memcpy((char *)ctx->bufs_ptr, (void *)ctx->header_data, sizeof(ctx->header_data));
        regs->av1d_paras.reg67_global_len = VDPU383_UNCMPS_HEADER_SIZE / 16; // 128 bit as unit
        regs->common_addr.reg131_gbl_base = ctx->bufs_fd;
        // mpp_dev_set_reg_offset(p_hal->dev, 131, ctx->offset_uncomps);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            char *cur_fname = "global_cfg.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, ctx->bufs_ptr,
                              8 * regs->av1d_paras.reg67_global_len * 16, 64, 0, 0);
        }
#endif
        // input strm
        p_hal->strm_len = (RK_S32)mpp_packet_get_length(task->dec.input_packet);
        regs->av1d_paras.reg66_stream_len = MPP_ALIGN(p_hal->strm_len + 15, 128);
        mpp_buf_slot_get_prop(p_hal->packet_slots, task->dec.input, SLOT_BUFFER, &mbuffer);
        regs->common_addr.reg128_strm_base = mpp_buffer_get_fd(mbuffer);
        regs->av1d_paras.reg65_strm_start_bit = (ctx->offset_uncomps & 0xf) * 8; // bit start to decode
        mpp_dev_set_reg_offset(p_hal->dev, 128, ctx->offset_uncomps & 0xfffffff0);
        /* error */
        regs->av1d_addrs.reg169_error_ref_base = mpp_buffer_get_fd(mbuffer);
#ifdef DUMP_AV1D_VDPU383_DATAS
        {
            char *cur_fname = "stream_in.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mbuffer)
                              + ctx->offset_uncomps,
                              8 * p_hal->strm_len, 128, 0, 0);
        }
        {
            char *cur_fname = "stream_in_no_offset.dat";
            memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
            sprintf(dump_cur_fname_path, "%s/%s", dump_cur_dir, cur_fname);
            dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mbuffer),
                              8 * p_hal->strm_len, 128, 0, 0);
        }
#endif
    }

    /* set reg -> rcb */
    vdpu383_av1d_rcb_setup(p_hal, dxva);
    vdpu383_av1d_rcb_reg_cfg(p_hal, p_hal->fast_mode ? ctx->rcb_bufs[task->dec.reg_index] : ctx->rcb_bufs[0]);

    /* set reg -> para (stride, len) */
    {
        RK_U32 hor_virstride = 0;
        RK_U32 ver_virstride = 0;
        RK_U32 y_virstride = 0;
        RK_U32 uv_virstride = 0;
        RK_U32 mapped_idx;

        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_FRAME_PTR, &mframe);
        if (mframe) {
            hor_virstride = mpp_frame_get_hor_stride(mframe);
            ver_virstride = mpp_frame_get_ver_stride(mframe);
            y_virstride = hor_virstride * ver_virstride;
            uv_virstride = hor_virstride * ver_virstride / 2;

            if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
                RK_U32 fbd_offset;
                RK_U32 fbc_hdr_stride = mpp_frame_get_fbc_hdr_stride(mframe);
                RK_U32 h = MPP_ALIGN(mpp_frame_get_height(mframe), 64);

                regs->ctrl_regs.reg9.fbc_e = 1;
                regs->av1d_paras.reg68_hor_virstride = fbc_hdr_stride / 64;
                fbd_offset = regs->av1d_paras.reg68_hor_virstride * h * 4;
                regs->av1d_addrs.reg193_fbc_payload_offset = fbd_offset;
            } else if (MPP_FRAME_FMT_IS_TILE(mpp_frame_get_fmt(mframe))) {
                regs->ctrl_regs.reg9.tile_e = 1;
                regs->av1d_paras.reg68_hor_virstride = MPP_ALIGN(hor_virstride * 6, 16) >> 4;
                regs->av1d_paras.reg70_y_virstride = (y_virstride + uv_virstride) >> 4;
            } else {
                regs->ctrl_regs.reg9.fbc_e = 0;
                regs->av1d_paras.reg68_hor_virstride = hor_virstride >> 4;
                regs->av1d_paras.reg69_raster_uv_hor_virstride = hor_virstride >> 4;
                regs->av1d_paras.reg70_y_virstride = y_virstride >> 4;
            }
            /* error */
            regs->av1d_paras.reg80_error_ref_hor_virstride = regs->av1d_paras.reg68_hor_virstride;
            regs->av1d_paras.reg81_error_ref_raster_uv_hor_virstride = regs->av1d_paras.reg69_raster_uv_hor_virstride;
            regs->av1d_paras.reg82_error_ref_virstride = regs->av1d_paras.reg70_y_virstride;
        }

        for (i = 0; i < ALLOWED_REFS_PER_FRAME_EX; ++i) {
            mapped_idx = dxva->ref_frame_idx[i];
            if (dxva->frame_refs[mapped_idx].Index != (CHAR)0xff && dxva->frame_refs[mapped_idx].Index != 0x7f) {
                mpp_buf_slot_get_prop(p_hal->slots, dxva->frame_refs[mapped_idx].Index, SLOT_FRAME_PTR, &mframe);
                if (mframe) {
                    hor_virstride = mpp_frame_get_hor_stride(mframe);
                    ver_virstride = mpp_frame_get_ver_stride(mframe);
                    y_virstride = hor_virstride * ver_virstride;
                    if (MPP_FRAME_FMT_IS_FBC(mpp_frame_get_fmt(mframe))) {
                        hor_virstride = mpp_frame_get_fbc_hdr_stride(mframe) / 4;
                    } else if (MPP_FRAME_FMT_IS_TILE(mpp_frame_get_fmt(mframe))) {
                        hor_virstride = MPP_ALIGN(hor_virstride * 6, 16);
                        y_virstride += y_virstride / 2;
                    }
                    SET_REF_HOR_VIRSTRIDE(regs->av1d_paras, mapped_idx, hor_virstride >> 4);
                    SET_REF_RASTER_UV_HOR_VIRSTRIDE(regs->av1d_paras, mapped_idx, hor_virstride >> 4);
                    SET_REF_VIRSTRIDE(regs->av1d_paras, mapped_idx, y_virstride >> 4);
                }
            }
        }
    }

    /* set reg -> para (ref, fbc, colmv) */
    {
        MppBuffer mbuffer = NULL;
        RK_U32 mapped_idx;
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_FRAME_PTR, &mframe);
        mpp_buf_slot_get_prop(p_hal->slots, task->dec.output, SLOT_BUFFER, &mbuffer);
        regs->av1d_addrs.reg168_decout_base = mpp_buffer_get_fd(mbuffer);
        regs->av1d_addrs.reg192_payload_st_cur_base = mpp_buffer_get_fd(mbuffer);
        // VDPU383_SET_BUF_PROTECT_VAL(mpp_buffer_get_ptr(mbuffer), mpp_buffer_get_size(mbuffer), 0xbb, 128);

        for (i = 0; i < ALLOWED_REFS_PER_FRAME_EX; i++) {
            mapped_idx = dxva->ref_frame_idx[i];
            if (dxva->frame_refs[mapped_idx].Index != (CHAR)0xff && dxva->frame_refs[mapped_idx].Index != 0x7f) {
                mpp_buf_slot_get_prop(p_hal->slots, dxva->frame_refs[mapped_idx].Index, SLOT_BUFFER, &mbuffer);
                if (ctx->origin_bufs && mpp_frame_get_thumbnail_en(mframe) == MPP_FRAME_THUMBNAIL_ONLY) {
                    origin_buf = hal_bufs_get_buf(ctx->origin_bufs, dxva->frame_refs[mapped_idx].Index);
                    mbuffer = origin_buf->buf[0];
                }
                if (mbuffer) {
                    SET_REF_BASE(regs->av1d_addrs, mapped_idx, mpp_buffer_get_fd(mbuffer));
                    SET_FBC_PAYLOAD_REF_BASE(regs->av1d_addrs, mapped_idx, mpp_buffer_get_fd(mbuffer));
                }
            }
        }

        HalBuf *mv_buf = NULL;
        vdpu383_av1d_colmv_setup(p_hal, dxva);
        mv_buf = hal_bufs_get_buf(ctx->colmv_bufs, dxva->CurrPic.Index7Bits);
        regs->av1d_addrs.reg216_colmv_cur_base = mpp_buffer_get_fd(mv_buf->buf[0]);
#ifdef DUMP_AV1D_VDPU383_DATAS
        memset(mpp_buffer_get_ptr(mv_buf->buf[0]), 0, mpp_buffer_get_size(mv_buf->buf[0]));
#endif
        for (i = 0; i < NUM_REF_FRAMES; i++) {
            if (dxva->frame_refs[i].Index != (CHAR)0xff && dxva->frame_refs[i].Index != 0x7f) {
                mv_buf = hal_bufs_get_buf(ctx->colmv_bufs, dxva->frame_refs[i].Index);
                regs->av1d_addrs.reg217_232_colmv_ref_base[i] = mpp_buffer_get_fd(mv_buf->buf[0]);
#ifdef DUMP_AV1D_VDPU383_DATAS
                {
                    char *cur_fname = "colmv_ref_frame";
                    memset(dump_cur_fname_path, 0, sizeof(dump_cur_fname_path));
                    sprintf(dump_cur_fname_path, "%s/%s%d.dat", dump_cur_dir, cur_fname, i);
                    dump_data_to_file(dump_cur_fname_path, (void *)mpp_buffer_get_ptr(mv_buf->buf[0]),
                                      8 * mpp_buffer_get_size(mv_buf->buf[0]), 64, 0, 0);
                }
#endif
            }
        }
    }

    {
        vdpu383_av1d_cdf_setup(p_hal, dxva);
        vdpu383_av1d_set_cdf(p_hal, dxva);
    }
    mpp_buffer_sync_end(ctx->bufs);

    {
        //scale down config
        MppBuffer mbuffer = NULL;
        RK_S32 fd = -1;
        MppFrameThumbnailMode thumbnail_mode;

        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits, SLOT_BUFFER, &mbuffer);
        mpp_buf_slot_get_prop(p_hal->slots, dxva->CurrPic.Index7Bits,
                              SLOT_FRAME_PTR, &mframe);
        thumbnail_mode = mpp_frame_get_thumbnail_en(mframe);
        fd = mpp_buffer_get_fd(mbuffer);

        switch (thumbnail_mode) {
        case MPP_FRAME_THUMBNAIL_ONLY:
            regs->common_addr.reg133_scale_down_base = fd;
            origin_buf = hal_bufs_get_buf(ctx->origin_bufs, dxva->CurrPic.Index7Bits);
            fd = mpp_buffer_get_fd(origin_buf->buf[0]);
            regs->av1d_addrs.reg168_decout_base = fd;
            regs->av1d_addrs.reg192_payload_st_cur_base = fd;
            regs->av1d_addrs.reg169_error_ref_base = fd;
            vdpu383_setup_down_scale(mframe, p_hal->dev, &regs->ctrl_regs,
                                     (void *)&regs->av1d_paras);
            break;
        case MPP_FRAME_THUMBNAIL_MIXED:
            regs->common_addr.reg133_scale_down_base = fd;
            vdpu383_setup_down_scale(mframe, p_hal->dev, &regs->ctrl_regs,
                                     (void *)&regs->av1d_paras);
            break;
        case MPP_FRAME_THUMBNAIL_NONE:
        default:
            regs->ctrl_regs.reg9.scale_down_en = 0;
            break;
        }
    }

__RETURN:
    return ret = MPP_OK;
}